

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

void Am_Put_Objects_Back_In_Place
               (Am_Object *group,Am_Value_List *objects,Am_Value_List *places,bool add_part)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  Am_Value *pAVar4;
  bool local_d5;
  byte local_d1;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  byte local_79;
  Am_Object local_78;
  byte local_69;
  Am_Object local_68;
  Am_Object local_60;
  byte local_51;
  Am_Object local_50 [3];
  Am_Object local_38;
  Am_Object place;
  Am_Object object;
  bool add_part_local;
  Am_Value_List *places_local;
  Am_Value_List *objects_local;
  Am_Object *group_local;
  
  uVar2 = Am_Value_List::Length(objects);
  uVar3 = Am_Value_List::Length(places);
  if (uVar2 == uVar3) {
    Am_Object::Am_Object(&place);
    Am_Object::Am_Object(&local_38);
    Am_Value_List::End(objects);
    Am_Value_List::End(places);
    while (bVar1 = Am_Value_List::First(objects), ((bVar1 ^ 0xffU) & 1) != 0) {
      pAVar4 = Am_Value_List::Get(objects);
      Am_Object::operator=(&place,pAVar4);
      pAVar4 = Am_Value_List::Get(places);
      Am_Object::operator=(&local_38,pAVar4);
      local_51 = 0;
      local_d1 = 0;
      if (add_part) {
        Am_Object::Get_Owner(local_50,(Am_Slot_Flags)&place);
        local_51 = 1;
        bVar1 = Am_Object::Valid(local_50);
        local_d1 = bVar1 ^ 0xff;
      }
      if ((local_51 & 1) != 0) {
        Am_Object::~Am_Object(local_50);
      }
      if ((local_d1 & 1) != 0) {
        Am_Object::Am_Object(&local_60,&place);
        Am_Object::Add_Part(group,&local_60,true,0);
        Am_Object::~Am_Object(&local_60);
      }
      local_69 = 0;
      local_79 = 0;
      bVar1 = Am_Object::Valid(&local_38);
      local_d5 = false;
      if (bVar1) {
        Am_Object::Get_Owner(&local_68,(Am_Slot_Flags)&local_38);
        local_69 = 1;
        Am_Object::Get_Owner(&local_78,(Am_Slot_Flags)&place);
        local_79 = 1;
        local_d5 = Am_Object::operator==(&local_68,&local_78);
      }
      if ((local_79 & 1) != 0) {
        Am_Object::~Am_Object(&local_78);
      }
      if ((local_69 & 1) != 0) {
        Am_Object::~Am_Object(&local_68);
      }
      if (local_d5 == false) {
        Am_Object::Am_Object(&local_98,&place);
        Am_To_Top(&local_98);
        Am_Object::~Am_Object(&local_98);
      }
      else {
        Am_Object::Am_Object(&local_88,&place);
        Am_Object::Am_Object(&local_90,&local_38);
        Am_Move_Object(&local_88,&local_90,false);
        Am_Object::~Am_Object(&local_90);
        Am_Object::~Am_Object(&local_88);
      }
      Am_Value_List::Prev(objects);
      Am_Value_List::Prev(places);
    }
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&place);
    return;
  }
  Am_Error("** Lists not the same length in put_back");
}

Assistant:

void
Am_Put_Objects_Back_In_Place(Am_Object group, Am_Value_List objects,
                             Am_Value_List places, bool add_part)
{
  //std::cout << "Put objects back into group " << group << " objects " << objects
  // << " places " << places <<std::endl <<std::flush;
  if (objects.Length() != places.Length())
    Am_Error("** Lists not the same length in put_back");
  //go through the lists backwards
  Am_Object object, place;
  Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                       "++ Adding parts " << objects << " to " << group);
  for (objects.End(), places.End(); !objects.First();
       objects.Prev(), places.Prev()) {
    object = objects.Get();
    place = places.Get();
    if (add_part && !object.Get_Owner().Valid())
      group.Add_Part(object);
    if (place.Valid() && place.Get_Owner() == object.Get_Owner())
      Am_Move_Object(object, place, false); //put object before place
    else
      Am_To_Top(object);
  }
}